

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_action(lysp_yin_ctx *ctx,tree_node_meta *act_meta)

{
  lysp_node *plVar1;
  lysp_node *plVar2;
  lysp_ext_instance *object;
  yin_subelement *subelems_00;
  LY_ERR LVar3;
  LY_ERR LVar4;
  lysp_node *parent;
  lysp_node *plVar5;
  LY_ERR ret__;
  lysp_node **pplVar6;
  ly_stmt current_element;
  yin_subelement *subelems;
  char **local_58;
  lysp_qname **local_50;
  lysp_node **local_48;
  lysp_qname **local_40;
  uint16_t *local_38;
  
  pplVar6 = act_meta->nodes;
  subelems = (yin_subelement *)0x0;
  plVar1 = act_meta->parent;
  parent = (lysp_node *)calloc(1,0x110);
  if (parent == (lysp_node *)0x0) {
    LVar3 = LY_EMEM;
    ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_action");
  }
  else {
    plVar2 = *pplVar6;
    if (*pplVar6 != (lysp_node *)0x0) {
      do {
        plVar5 = plVar2;
        plVar2 = plVar5->next;
      } while (plVar2 != (lysp_node *)0x0);
      pplVar6 = &plVar5->next;
    }
    *pplVar6 = parent;
    plVar2 = act_meta->parent;
    parent->nodetype = (ushort)(plVar2 != (lysp_node *)0x0) * 0x100 + 0x100;
    parent->parent = plVar2;
    LVar3 = lyxml_ctx_next(ctx->xmlctx);
    if (LVar3 == LY_SUCCESS) {
      current_element = (uint)(plVar1 == (lysp_node *)0x0) * 8 + LY_STMT_ACTION;
      LVar3 = yin_parse_attribute(ctx,YIN_ARG_NAME,&parent->name,Y_IDENTIF_ARG,current_element);
      if (LVar3 == LY_SUCCESS) {
        local_38 = &parent[1].nodetype;
        local_40 = &parent->iffeatures;
        local_48 = &parent[1].next;
        local_50 = &parent[2].iffeatures;
        local_58 = &parent->ref;
        LVar4 = subelems_allocator(ctx,9,parent,&subelems,0x80000,&parent->dsc,2,0x800,local_38,0,
                                   0x130000,local_40,0,2,local_48,2,4,local_50,2,0x270000,local_58,2
                                   ,0x2c0000,&parent->flags,2,0x2f0000,parent + 1,0,0xf0000,0,0);
        subelems_00 = subelems;
        LVar3 = LY_EMEM;
        if (LVar4 == LY_SUCCESS) {
          LVar3 = yin_parse_content(ctx,subelems,9,parent,current_element,(char **)0x0,&parent->exts
                                   );
          subelems_deallocator(9,subelems_00);
          if (LVar3 == LY_SUCCESS) {
            if (*(short *)&parent[1].name == 0) {
              *(undefined2 *)&parent[1].name = 0x1000;
              parent[1].next = parent;
              LVar3 = lydict_insert((ly_ctx *)
                                    **(undefined8 **)
                                      (ctx->parsed_mods->field_2).dnodes
                                      [ctx->parsed_mods->count - 1],"input",0,&parent[1].ref);
              if (LVar3 != LY_SUCCESS) {
                return LVar3;
              }
            }
            if (*(short *)&parent[2].exts == 0) {
              *(undefined2 *)&parent[2].exts = 0x2000;
              parent[2].iffeatures = (lysp_qname *)parent;
              LVar3 = lydict_insert((ly_ctx *)
                                    **(undefined8 **)
                                      (ctx->parsed_mods->field_2).dnodes
                                      [ctx->parsed_mods->count - 1],"output",0,
                                    (char **)&parent[3].nodetype);
              if (LVar3 != LY_SUCCESS) {
                return LVar3;
              }
            }
            object = parent->exts;
            if (object != (lysp_ext_instance *)0x0) {
              LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,object,'\x01',(uint32_t *)0x0);
              if (LVar3 != LY_SUCCESS) {
                return LVar3 + (LVar3 == LY_SUCCESS);
              }
            }
            LVar3 = LY_SUCCESS;
          }
        }
      }
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
yin_parse_action(struct lysp_yin_ctx *ctx, struct tree_node_meta *act_meta)
{
    struct lysp_node_action *act, **acts = (struct lysp_node_action **)act_meta->nodes;
    LY_ERR ret = LY_SUCCESS;
    struct yin_subelement *subelems = NULL;
    size_t subelems_size;
    enum ly_stmt kw = act_meta->parent ? LY_STMT_ACTION : LY_STMT_RPC;

    /* create new action */
    LY_LIST_NEW_RET(ctx->xmlctx->ctx, acts, act, next, LY_EMEM);
    act->nodetype = act_meta->parent ? LYS_ACTION : LYS_RPC;
    act->parent = act_meta->parent;

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &act->name, Y_IDENTIF_ARG, kw));

    /* parse content */
    LY_CHECK_RET(subelems_allocator(ctx, subelems_size = 9, (struct lysp_node *)act, &subelems,
            LY_STMT_DESCRIPTION, &act->dsc, YIN_SUBELEM_UNIQUE,
            LY_STMT_GROUPING, &act->groupings, 0,
            LY_STMT_IF_FEATURE, &act->iffeatures, 0,
            LY_STMT_INPUT, &act->input, YIN_SUBELEM_UNIQUE,
            LY_STMT_OUTPUT, &act->output, YIN_SUBELEM_UNIQUE,
            LY_STMT_REFERENCE, &act->ref, YIN_SUBELEM_UNIQUE,
            LY_STMT_STATUS, &act->flags, YIN_SUBELEM_UNIQUE,
            LY_STMT_TYPEDEF, &act->typedefs, 0,
            LY_STMT_EXTENSION_INSTANCE, NULL, 0));
    ret = (yin_parse_content(ctx, subelems, subelems_size, act, kw, NULL, &act->exts));
    subelems_deallocator(subelems_size, subelems);
    LY_CHECK_RET(ret);

    /* always initialize inout, they are technically present (needed for later deviations/refines) */
    if (!act->input.nodetype) {
        act->input.nodetype = LYS_INPUT;
        act->input.parent = (struct lysp_node *)act;
        LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), "input", 0, &act->input.name));
    }
    if (!act->output.nodetype) {
        act->output.nodetype = LYS_OUTPUT;
        act->output.parent = (struct lysp_node *)act;
        LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), "output", 0, &act->output.name));
    }

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, act->exts));

    return LY_SUCCESS;
}